

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O0

void __thiscall brynet::net::HTTPParser::HTTPParser(HTTPParser *this,http_parser_type parserType)

{
  http_parser_type parserType_local;
  HTTPParser *this_local;
  
  this->mParserType = parserType;
  std::__cxx11::string::string((string *)&this->mCurrentField);
  std::__cxx11::string::string((string *)&this->mCurrentValue);
  std::__cxx11::string::string((string *)&this->mPath);
  std::__cxx11::string::string((string *)&this->mQuery);
  std::__cxx11::string::string((string *)&this->mStatus);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->mHeadValues);
  std::__cxx11::string::string((string *)&this->mUrl);
  std::__cxx11::string::string((string *)&this->mBody);
  std::__cxx11::string::string((string *)&this->mWSCacheFrame);
  std::__cxx11::string::string((string *)&this->mWSParsePayload);
  this->mLastWasValue = true;
  this->mIsWebSocket = false;
  this->mIsKeepAlive = false;
  this->mISCompleted = false;
  (this->mSettings).on_status = sStatusHandle;
  (this->mSettings).on_body = sBodyHandle;
  (this->mSettings).on_url = sUrlHandle;
  (this->mSettings).on_header_field = sHeadField;
  (this->mSettings).on_header_value = sHeadValue;
  (this->mSettings).on_headers_complete = sHeadComplete;
  (this->mSettings).on_message_begin = sMessageBegin;
  (this->mSettings).on_message_complete = sMessageEnd;
  (this->mSettings).on_chunk_header = sChunkHeader;
  (this->mSettings).on_chunk_complete = sChunkComplete;
  (this->mParser).data = this;
  http_parser_init(&this->mParser,this->mParserType);
  return;
}

Assistant:

HTTPParser::HTTPParser(http_parser_type parserType) : mParserType(parserType)
{
    mLastWasValue = true;

    mIsWebSocket = false;
    mIsKeepAlive = false;
    mISCompleted = false;
    mSettings.on_status = sStatusHandle;
    mSettings.on_body = sBodyHandle;
    mSettings.on_url = sUrlHandle;
    mSettings.on_header_field = sHeadField;
    mSettings.on_header_value = sHeadValue;
    mSettings.on_headers_complete = sHeadComplete;
    mSettings.on_message_begin = sMessageBegin;
    mSettings.on_message_complete = sMessageEnd;
    mSettings.on_chunk_header = sChunkHeader;
    mSettings.on_chunk_complete = sChunkComplete;
    mParser.data = this;

    http_parser_init(&mParser, mParserType);
}